

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

void wallet::SetFeeEstimateMode
               (CWallet *wallet,CCoinControl *cc,UniValue *conf_target,UniValue *estimate_mode,
               UniValue *fee_rate,bool override_min_fee)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  _Storage<CFeeRate,_true> _Var4;
  Chain *pCVar5;
  UniValue *pUVar6;
  long in_FS_OFFSET;
  allocator<char> local_51;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (fee_rate->typ == VNULL) {
    if (estimate_mode->typ != VNULL) {
      psVar3 = UniValue::get_str_abi_cxx11_(estimate_mode);
      bVar1 = common::FeeModeFromString(psVar3,&cc->m_fee_mode);
      if (!bVar1) {
        pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
        common::InvalidEstimateModeErrorMessage_abi_cxx11_();
        JSONRPCError(pUVar6,-8,&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00278a08;
      }
    }
    if (conf_target->typ != VNULL) {
      pCVar5 = CWallet::chain(wallet);
      uVar2 = (**(code **)(*(long *)pCVar5 + 0xe0))(pCVar5);
      uVar2 = ParseConfirmTarget(conf_target,uVar2);
      (cc->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)((ulong)uVar2 | 0x100000000);
    }
  }
  else {
    if (conf_target->typ != VNULL) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "Cannot specify both conf_target and fee_rate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate."
                 ,&local_51);
      JSONRPCError(pUVar6,-8,&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00278a08;
    }
    if (estimate_mode->typ != VNULL) {
      psVar3 = UniValue::get_str_abi_cxx11_(estimate_mode);
      bVar1 = std::operator==(psVar3,"unset");
      if (!bVar1) {
        pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Cannot specify both estimate_mode and fee_rate",&local_51);
        JSONRPCError(pUVar6,-8,&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00278a08;
      }
    }
    _Var4 = (_Storage<CFeeRate,_true>)AmountFromValue(fee_rate,3);
    if ((cc->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged == false) {
      (cc->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged = true;
    }
    (cc->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload = _Var4;
    if (override_min_fee) {
      cc->fOverrideFeeRate = true;
    }
    if ((cc->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged == false) {
      (cc->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00278a08:
  __stack_chk_fail();
}

Assistant:

static void SetFeeEstimateMode(const CWallet& wallet, CCoinControl& cc, const UniValue& conf_target, const UniValue& estimate_mode, const UniValue& fee_rate, bool override_min_fee)
{
    if (!fee_rate.isNull()) {
        if (!conf_target.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both conf_target and fee_rate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate.");
        }
        if (!estimate_mode.isNull() && estimate_mode.get_str() != "unset") {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both estimate_mode and fee_rate");
        }
        // Fee rates in sat/vB cannot represent more than 3 significant digits.
        cc.m_feerate = CFeeRate{AmountFromValue(fee_rate, /*decimals=*/3)};
        if (override_min_fee) cc.fOverrideFeeRate = true;
        // Default RBF to true for explicit fee_rate, if unset.
        if (!cc.m_signal_bip125_rbf) cc.m_signal_bip125_rbf = true;
        return;
    }
    if (!estimate_mode.isNull() && !FeeModeFromString(estimate_mode.get_str(), cc.m_fee_mode)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, InvalidEstimateModeErrorMessage());
    }
    if (!conf_target.isNull()) {
        cc.m_confirm_target = ParseConfirmTarget(conf_target, wallet.chain().estimateMaxBlocks());
    }
}